

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.h
# Opt level: O0

void __thiscall
xray_re::xr_reader::
r_seq<std::vector<xray_re::wm_object,std::allocator<xray_re::wm_object>>,read_wallmark>
          (xr_reader *this,vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_> *n,
          vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_> *container)

{
  vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_> *this_00;
  reference wm;
  wm_object local_78;
  vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_> *local_28;
  vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_> *container_local;
  size_t n_local;
  xr_reader *this_local;
  
  local_28 = container;
  container_local = n;
  n_local = (size_t)this;
  std::vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>::reserve
            (container,(size_type)n);
  while (this_00 = local_28,
        container_local != (vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_> *)0x0) {
    local_78.vertices.super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.vertices.super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.height = 0.0;
    local_78.rotate = 0.0;
    local_78.vertices.super__Vector_base<xray_re::wm_vertex,_std::allocator<xray_re::wm_vertex>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.bsphere.p.field_0._4_8_ = 0;
    local_78.bsphere.r = 0.0;
    local_78.width = 0.0;
    local_78.bbox.field_0._12_8_ = 0;
    local_78._24_8_ = 0;
    local_78._0_8_ = 0;
    local_78.bbox.field_0._4_8_ = 0;
    container_local =
         (vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_> *)
         ((long)&container_local[-1].
                 super__Vector_base<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage + 7);
    wm_object::wm_object(&local_78);
    std::vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>::push_back
              (this_00,&local_78);
    wm_object::~wm_object(&local_78);
    wm = std::vector<xray_re::wm_object,_std::allocator<xray_re::wm_object>_>::back(local_28);
    read_wallmark::operator()((read_wallmark *)((long)&this_local + 7),wm,this);
  }
  return;
}

Assistant:

inline void xr_reader::r_seq(size_t n, T& container, F read)
{
	container.reserve(n);
	while (n--) {
		container.push_back(typename T::value_type());
		read(container.back(), *this);
	}
}